

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::Swap(DynamicMapField *this,MapFieldBase *other)

{
  State SVar1;
  RepeatedPtrField<google::protobuf::Message> *pRVar2;
  long lVar3;
  
  if (other != (MapFieldBase *)0x0) {
    lVar3 = __dynamic_cast(other,&MapFieldBase::typeinfo,&typeinfo,0);
    if (lVar3 == 0) {
      __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/casts.h"
                    ,0x5e,
                    "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::internal::DynamicMapField *, From = google::protobuf::internal::MapFieldBase]"
                   );
    }
  }
  pRVar2 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.repeated_field_ = other->repeated_field_;
  other->repeated_field_ = pRVar2;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::swap
            (&this->map_,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(other + 1)
            );
  SVar1 = (other->state_)._M_i;
  (other->state_)._M_i =
       (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
       ).super_MapFieldBase.state_._M_i;
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.state_._M_i = SVar1;
  return;
}

Assistant:

void DynamicMapField::Swap(MapFieldBase* other) {
  DynamicMapField* other_field = down_cast<DynamicMapField*>(other);
  std::swap(this->MapFieldBase::repeated_field_, other_field->repeated_field_);
  map_.swap(other_field->map_);
  // a relaxed swap of the atomic
  auto other_state = other_field->state_.load(std::memory_order_relaxed);
  auto this_state = this->MapFieldBase::state_.load(std::memory_order_relaxed);
  other_field->state_.store(this_state, std::memory_order_relaxed);
  this->MapFieldBase::state_.store(other_state, std::memory_order_relaxed);
}